

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O0

int32_t zng_inflateReset(zng_stream *strm)

{
  internal_state *strm_00;
  int iVar1;
  zng_stream *in_RDI;
  inflate_state *state;
  int32_t local_4;
  
  iVar1 = inflateStateCheck(in_RDI);
  if (iVar1 == 0) {
    strm_00 = in_RDI->state;
    strm_00->w_size = 0;
    strm_00->w_mask = 0;
    strm_00->lookahead = 0;
    local_4 = zng_inflateResetKeep((zng_stream *)strm_00);
  }
  else {
    local_4 = -2;
  }
  return local_4;
}

Assistant:

int32_t Z_EXPORT PREFIX(inflateReset)(PREFIX3(stream) *strm) {
    struct inflate_state *state;

    if (inflateStateCheck(strm))
        return Z_STREAM_ERROR;
    state = (struct inflate_state *)strm->state;
    state->wsize = 0;
    state->whave = 0;
    state->wnext = 0;
    return PREFIX(inflateResetKeep)(strm);
}